

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  ImFontAtlasCustomRect local_28;
  
  local_28.X = 0xffff;
  local_28.Y = 0xffff;
  local_28.GlyphAdvanceX = 0.0;
  local_28.GlyphOffset.x = 0.0;
  local_28._20_8_ = 0;
  local_28.Font._4_4_ = 0;
  local_28.Width = (unsigned_short)width;
  local_28.Height = (unsigned_short)height;
  local_28.ID = id;
  ImVector<ImFontAtlasCustomRect>::push_back(&this->CustomRects,&local_28);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    // Breaking change on 2019/11/21 (1.74): ImFontAtlas::AddCustomRectRegular() now requires an ID >= 0x110000 (instead of >= 0x10000)
    IM_ASSERT(id >= 0x110000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}